

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int ncnn::cpu_support_x86_avx_vnni_int16(void)

{
  try_initialize_global_cpu_info();
  return g_cpu_support_x86_avx_vnni_int16;
}

Assistant:

int cpu_support_x86_avx_vnni_int16()
{
    try_initialize_global_cpu_info();
#if defined(__i386__) || defined(__x86_64__) || defined(_M_IX86) || defined(_M_X64)
    return g_cpu_support_x86_avx_vnni_int16;
#else
    return 0;
#endif
}